

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void update_gm_stats(AV1_COMP *cpi)

{
  byte bVar1;
  int update_actual_stats;
  int is_gm_present;
  int i;
  FRAME_UPDATE_TYPE update_type;
  AV1_COMP *cpi_local;
  
  bVar1 = (cpi->ppi->gf_group).update_type[cpi->gf_frame_index];
  is_gm_present = 0;
  i = 0;
  do {
    if (7 < i) {
LAB_0021d77a:
      if (cpi->ppi->valid_gm_model_found[bVar1] == 0x7fffffff) {
        cpi->ppi->valid_gm_model_found[bVar1] = is_gm_present;
      }
      else {
        cpi->ppi->valid_gm_model_found[bVar1] =
             is_gm_present | cpi->ppi->valid_gm_model_found[bVar1];
      }
      return;
    }
    if ((cpi->common).global_motion[i].wmtype != '\0') {
      is_gm_present = 1;
      goto LAB_0021d77a;
    }
    i = i + 1;
  } while( true );
}

Assistant:

static inline void update_gm_stats(AV1_COMP *cpi) {
  FRAME_UPDATE_TYPE update_type =
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index];
  int i, is_gm_present = 0;

  // Check if the current frame has any valid global motion model across its
  // reference frames
  for (i = 0; i < REF_FRAMES; i++) {
    if (cpi->common.global_motion[i].wmtype != IDENTITY) {
      is_gm_present = 1;
      break;
    }
  }
  int update_actual_stats = 1;
#if CONFIG_FPMT_TEST
  update_actual_stats =
      (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) ? 0 : 1;
  if (!update_actual_stats) {
    if (cpi->ppi->temp_valid_gm_model_found[update_type] == INT32_MAX) {
      cpi->ppi->temp_valid_gm_model_found[update_type] = is_gm_present;
    } else {
      cpi->ppi->temp_valid_gm_model_found[update_type] |= is_gm_present;
    }
    int show_existing_between_parallel_frames =
        (cpi->ppi->gf_group.update_type[cpi->gf_frame_index] ==
             INTNL_OVERLAY_UPDATE &&
         cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index + 1] == 2);
    if (cpi->do_frame_data_update == 1 &&
        !show_existing_between_parallel_frames) {
      for (i = 0; i < FRAME_UPDATE_TYPES; i++) {
        cpi->ppi->valid_gm_model_found[i] =
            cpi->ppi->temp_valid_gm_model_found[i];
      }
    }
  }
#endif
  if (update_actual_stats) {
    if (cpi->ppi->valid_gm_model_found[update_type] == INT32_MAX) {
      cpi->ppi->valid_gm_model_found[update_type] = is_gm_present;
    } else {
      cpi->ppi->valid_gm_model_found[update_type] |= is_gm_present;
    }
  }
}